

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
           (uint *begin,uint *end)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  pVar10;
  
  lVar5 = 8;
  while( true ) {
    uVar9 = *(uint *)((long)begin + lVar5);
    uVar3 = (ulong)uVar9;
    uVar2 = (uint)*(undefined8 *)begin;
    if (((int)uVar2 <= (int)uVar9) &&
       ((uVar4 = (uint)((ulong)*(undefined8 *)begin >> 0x20), (int)uVar2 < (int)uVar9 ||
        ((int)uVar4 <= *(int *)((long)begin + lVar5 + 4))))) break;
    lVar5 = lVar5 + 8;
  }
  puVar1 = (uint *)((long)begin + lVar5);
  if (lVar5 == 8) {
    while (puVar7 = end, end = puVar7, puVar1 < puVar7) {
      end = puVar7 + -2;
      if (((int)puVar7[-2] < (int)uVar2) ||
         (((int)puVar7[-2] <= (int)uVar2 && ((int)puVar7[-1] < (int)uVar4)))) break;
    }
  }
  else {
    do {
      puVar7 = end;
      end = puVar7 + -2;
      if ((int)puVar7[-2] < (int)uVar2) break;
    } while (((int)uVar2 < (int)puVar7[-2]) || ((int)uVar4 <= (int)puVar7[-1]));
  }
  puVar7 = puVar1;
  if (puVar1 < end) {
    uVar9 = *end;
    puVar8 = end;
    do {
      *puVar7 = uVar9;
      *puVar8 = (uint)uVar3;
      uVar9 = puVar7[1];
      puVar7[1] = puVar8[1];
      puVar8[1] = uVar9;
      do {
        do {
          puVar6 = puVar7;
          puVar7 = puVar6 + 2;
          uVar9 = *puVar7;
          uVar3 = (ulong)uVar9;
        } while ((int)uVar9 < (int)uVar2);
      } while (((int)uVar9 <= (int)uVar2) && ((int)puVar6[3] < (int)uVar4));
      do {
        puVar6 = puVar8;
        uVar9 = puVar6[-2];
        puVar8 = puVar6 + -2;
        if ((int)uVar9 < (int)uVar2) break;
      } while (((int)uVar2 < (int)uVar9) || ((int)uVar4 <= (int)puVar6[-1]));
    } while (puVar7 < puVar8);
  }
  pVar10._9_7_ = (undefined7)(uVar3 >> 8);
  pVar10.second = end <= puVar1;
  *begin = puVar7[-2];
  begin[1] = puVar7[-1];
  puVar7[-2] = uVar2;
  puVar7[-1] = uVar4;
  pVar10.first._M_current = (pair<int,_int> *)(puVar7 + -2);
  return pVar10;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }